

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesDH41
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  size_t sVar8;
  size_t sVar9;
  BrotliEncoderDictionary *pBVar10;
  void *pvVar11;
  void *pvVar12;
  HasherCommon *pHVar13;
  PreparedDictionary *pPVar14;
  uint8_t *puVar15;
  BrotliDictionary *pBVar16;
  size_t sVar17;
  int iVar18;
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  undefined8 *puVar22;
  ulong uVar23;
  byte bVar24;
  ushort uVar25;
  ushort uVar26;
  size_t sVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  ulong *puVar31;
  char *pcVar32;
  uint32_t uVar33;
  uint uVar34;
  int iVar35;
  uint *puVar36;
  ulong uVar37;
  int iVar38;
  uint32_t *addr;
  ulong uVar39;
  size_t sVar40;
  ulong uVar41;
  ulong *puVar42;
  byte bVar43;
  uint16_t uVar44;
  ulong uVar45;
  uint uVar46;
  uint uVar47;
  ulong uVar48;
  ulong uVar49;
  long lVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  size_t sVar57;
  ulong uVar58;
  char cVar59;
  uint8_t *s1_orig;
  ulong uVar60;
  ulong *puVar61;
  bool bVar62;
  ulong local_1b8;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  ulong local_188;
  size_t local_180;
  ulong local_170;
  ulong local_160;
  ulong local_150;
  ulong local_140;
  ulong local_128;
  ulong local_118;
  Command *local_108;
  int local_f0;
  uint local_ec;
  ulong local_e8;
  
  uVar21 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar5 = (position - 3) + num_bytes;
  sVar27 = position;
  if (3 < num_bytes) {
    sVar27 = uVar5;
  }
  lVar28 = 0x200;
  if (params->quality < 9) {
    lVar28 = 0x40;
  }
  sVar8 = params->stream_offset;
  local_180 = *last_insert_len;
  iVar35 = *dist_cache;
  sVar9 = (params->dictionary).compound.total_size;
  dist_cache[4] = iVar35 + -1;
  dist_cache[5] = iVar35 + 1;
  dist_cache[6] = iVar35 + -2;
  dist_cache[7] = iVar35 + 2;
  *(ulong *)(dist_cache + 8) = CONCAT44(iVar35 + 3,iVar35 + -3);
  uVar3 = position + num_bytes;
  uVar6 = (position - 4) + num_bytes;
  lVar4 = position - 1;
  uVar37 = lVar28 + position;
  lVar1 = sVar9 + 1;
  local_108 = commands;
LAB_01f3556e:
LAB_01f3557c:
  uVar23 = position;
  if (uVar3 <= uVar23 + 4) {
    *last_insert_len = (local_180 + uVar3) - uVar23;
    *num_commands = *num_commands + ((long)local_108 - (long)commands >> 4);
    return;
  }
  uVar48 = uVar21;
  if (uVar23 < uVar21) {
    uVar48 = uVar23;
  }
  uVar49 = sVar8 + uVar23;
  if (uVar21 <= sVar8 + uVar23) {
    uVar49 = uVar21;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_ec = 0;
    bVar24 = 0;
    goto LAB_01f3561d;
  }
  if (uVar23 == 0) {
    bVar24 = 0;
LAB_01f355f5:
    uVar54 = 0;
  }
  else {
    bVar24 = ringbuffer[uVar23 - 1 & ringbuffer_mask];
    if (uVar23 == 1) goto LAB_01f355f5;
    uVar54 = (ulong)ringbuffer[uVar23 - 2 & ringbuffer_mask];
  }
  local_ec = (uint)(params->dictionary).contextual.context_map
                   [literal_context_lut[uVar54 + 0x100] | literal_context_lut[bVar24]];
LAB_01f3561d:
  local_140 = uVar3 - uVar23;
  pBVar10 = (params->dictionary).contextual.dict[local_ec];
  uVar54 = (params->dist).max_distance;
  pvVar11 = (hasher->privat)._H40.extra[0];
  pvVar12 = (hasher->privat)._H40.extra[1];
  uVar29 = uVar23 & ringbuffer_mask;
  puVar61 = (ulong *)(ringbuffer + uVar29);
  uVar20 = (uint)(*(int *)(ringbuffer + uVar29) * 0x1e35a7bd) >> 0x11;
  uVar60 = 0x7e4;
  uVar58 = 0;
  uVar51 = 0;
  lVar50 = 0;
  local_1b8 = 0;
  do {
    cVar59 = (char)uVar20;
    if (lVar50 == 10) {
      uVar55 = (ulong)uVar20;
      sVar57 = (hasher->privat)._H5.block_size_;
      uVar52 = uVar23 - *(uint *)((long)pvVar11 + uVar55 * 4);
      uVar25 = *(ushort *)((long)pvVar11 + uVar55 * 2 + 0x20000);
      uVar41 = 0;
      uVar30 = uVar52;
      uVar45 = local_1b8;
      do {
        local_1b8 = uVar45;
        uVar39 = uVar60;
        local_160 = uVar51;
        local_150 = uVar58;
        do {
          do {
            do {
              do {
                bVar62 = sVar57 == 0;
                sVar57 = sVar57 - 1;
                if ((bVar62) || (uVar41 = uVar41 + uVar30, uVar48 < uVar41)) {
                  uVar25 = (hasher->privat)._H42.free_slot_idx[0];
                  (hasher->privat)._H42.free_slot_idx[0] = uVar25 + 1;
                  if (0xfffe < uVar52) {
                    uVar52 = 0xffff;
                  }
                  *(char *)((long)pvVar11 + (uVar23 & 0xffff) + 0x30000) = cVar59;
                  *(short *)((long)pvVar12 + (ulong)uVar25 * 4) = (short)uVar52;
                  *(undefined2 *)((long)pvVar12 + (ulong)uVar25 * 4 + 2) =
                       *(undefined2 *)((long)pvVar11 + uVar55 * 2 + 0x20000);
                  *(int *)((long)pvVar11 + uVar55 * 4) = (int)uVar23;
                  *(ushort *)((long)pvVar11 + uVar55 * 2 + 0x20000) = uVar25;
                  if (uVar39 != 0x7e4) {
                    iVar35 = 0;
                    goto LAB_01f35ba0;
                  }
                  pHVar13 = (hasher->privat)._H5.common_;
                  uVar48 = pHVar13->dict_num_lookups;
                  local_188 = pHVar13->dict_num_matches;
                  uVar39 = 0x7e4;
                  if (uVar48 >> 7 <= local_188) {
                    uVar58 = (ulong)((uint)((int)*puVar61 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                    puVar15 = pBVar10->hash_table_lengths;
                    iVar35 = 0;
                    lVar50 = 0;
                    goto LAB_01f359f1;
                  }
                  iVar35 = 0;
                  goto LAB_01f35ba0;
                }
                uVar58 = (ulong)uVar25;
                uVar25 = *(ushort *)((long)pvVar12 + uVar58 * 4 + 2);
                uVar30 = (ulong)*(ushort *)((long)pvVar12 + uVar58 * 4);
              } while (ringbuffer_mask < uVar29 + local_1b8);
              uVar51 = uVar23 - uVar41 & ringbuffer_mask;
              uVar58 = uVar51 + local_1b8;
            } while ((ringbuffer_mask < uVar58) ||
                    (ringbuffer[uVar29 + local_1b8] != ringbuffer[uVar58]));
            puVar31 = (ulong *)(ringbuffer + uVar51);
            lVar50 = 0;
            puVar42 = puVar61;
            uVar58 = local_140;
LAB_01f3584c:
            if (uVar58 < 8) {
              for (uVar51 = 0;
                  (uVar58 != uVar51 &&
                  (*(char *)((long)puVar31 + uVar51) == *(char *)((long)puVar42 + uVar51)));
                  uVar51 = uVar51 + 1) {
              }
              uVar51 = uVar51 - lVar50;
            }
            else {
              if (*puVar42 == *puVar31) goto code_r0x01f3585d;
              uVar51 = *puVar31 ^ *puVar42;
              uVar58 = 0;
              if (uVar51 != 0) {
                for (; (uVar51 >> uVar58 & 1) == 0; uVar58 = uVar58 + 1) {
                }
              }
              uVar51 = (uVar58 >> 3 & 0x1fffffff) - lVar50;
            }
          } while (uVar51 < 4);
          iVar35 = 0x1f;
          if ((uint)uVar41 != 0) {
            for (; (uint)uVar41 >> iVar35 == 0; iVar35 = iVar35 + -1) {
            }
          }
          uVar60 = (ulong)(iVar35 * -0x1e + 0x780) + uVar51 * 0x87;
          uVar58 = uVar41;
          uVar45 = uVar51;
        } while (uVar60 <= uVar39);
      } while( true );
    }
    uVar45 = (ulong)dist_cache[lVar50];
    uVar30 = uVar23 - uVar45;
    if ((((lVar50 == 0) || (*(char *)((long)pvVar11 + (uVar30 & 0xffff) + 0x30000) == cVar59)) &&
        (uVar45 <= uVar48)) && (uVar30 < uVar23)) {
      puVar31 = (ulong *)(ringbuffer + (uVar30 & ringbuffer_mask));
      lVar56 = 0;
      puVar42 = puVar61;
      uVar30 = local_140;
LAB_01f356e9:
      if (uVar30 < 8) {
        for (uVar41 = 0;
            (uVar30 != uVar41 &&
            (*(char *)((long)puVar31 + uVar41) == *(char *)((long)puVar42 + uVar41)));
            uVar41 = uVar41 + 1) {
        }
      }
      else {
        if (*puVar42 == *puVar31) goto code_r0x01f356fa;
        uVar41 = *puVar31 ^ *puVar42;
        uVar30 = 0;
        if (uVar41 != 0) {
          for (; (uVar41 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
          }
        }
        uVar41 = uVar30 >> 3 & 0x1fffffff;
      }
      uVar41 = uVar41 - lVar56;
      if ((1 < uVar41) && (uVar30 = uVar41 * 0x87 + 0x78f, uVar60 < uVar30)) {
        if (lVar50 != 0) {
          uVar30 = uVar30 - ((0x1ca10U >> ((byte)lVar50 & 0xe) & 0xe) + 0x27);
        }
        if (uVar60 < uVar30) {
          uVar58 = uVar45;
          uVar51 = uVar41;
          uVar60 = uVar30;
          local_1b8 = uVar41;
        }
      }
    }
    lVar50 = lVar50 + 1;
  } while( true );
LAB_01f359f1:
  if (lVar50 == 2) goto LAB_01f35ba0;
  uVar48 = uVar48 + 1;
  pHVar13->dict_num_lookups = uVar48;
  bVar7 = puVar15[uVar58];
  uVar51 = (ulong)bVar7;
  if ((uVar51 != 0) && (uVar51 <= local_140)) {
    pBVar16 = pBVar10->words;
    puVar31 = (ulong *)(pBVar16->data +
                       (ulong)pBVar16->offsets_by_length[uVar51] +
                       pBVar10->hash_table_words[uVar58] * uVar51);
    lVar56 = 0;
    uVar60 = uVar51;
    puVar42 = puVar61;
LAB_01f35a5a:
    if (uVar60 < 8) {
      for (uVar60 = 0;
          ((bVar7 & 7) != uVar60 &&
          (*(char *)((long)puVar42 + uVar60) == *(char *)((long)puVar31 + uVar60)));
          uVar60 = uVar60 + 1) {
      }
      uVar60 = uVar60 - lVar56;
    }
    else {
      if (*puVar31 == *puVar42) goto code_r0x01f35a6c;
      uVar30 = *puVar42 ^ *puVar31;
      uVar60 = 0;
      if (uVar30 != 0) {
        for (; (uVar30 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
        }
      }
      uVar60 = (uVar60 >> 3 & 0x1fffffff) - lVar56;
    }
    if (((uVar60 != 0) && (uVar51 < pBVar10->cutoffTransformsCount + uVar60)) &&
       (uVar51 = (ulong)pBVar10->hash_table_words[uVar58] + uVar49 + lVar1 +
                 ((ulong)((uint)(pBVar10->cutoffTransforms >>
                                ((char)(uVar51 - uVar60) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar51 - uVar60) * 4 << (pBVar16->size_bits_by_length[uVar51] & 0x3f)),
       uVar51 <= uVar54)) {
      iVar38 = 0x1f;
      if ((uint)uVar51 != 0) {
        for (; (uint)uVar51 >> iVar38 == 0; iVar38 = iVar38 + -1) {
        }
      }
      uVar30 = (uVar60 * 0x87 - (ulong)(uint)(iVar38 * 0x1e)) + 0x780;
      if (uVar39 <= uVar30) {
        iVar35 = (uint)bVar7 - (int)uVar60;
        local_188 = local_188 + 1;
        pHVar13->dict_num_matches = local_188;
        uVar39 = uVar30;
        local_150 = uVar51;
        local_160 = uVar60;
      }
    }
  }
  lVar50 = lVar50 + 1;
  uVar58 = uVar58 + 1;
  goto LAB_01f359f1;
LAB_01f35ba0:
  local_128 = (params->dist).max_distance;
  sVar57 = 0;
LAB_01f35bc7:
  if (sVar57 != (params->dictionary).compound.num_chunks) {
    pPVar14 = (params->dictionary).compound.chunks[sVar57];
    bVar7 = (byte)pPVar14->bucket_bits;
    bVar43 = (byte)pPVar14->slot_bits;
    bVar19 = -(char)pPVar14->hash_bits;
    uVar48 = ((*puVar61 << (bVar19 & 0x3f)) >> (bVar19 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar7 & 0x3f);
    lVar50 = (1L << (bVar43 & 0x3f)) * 4;
    lVar56 = (1L << (bVar7 & 0x3f)) * 2;
    bVar43 = -bVar43;
    uVar20 = (uint)*(ushort *)((long)&pPVar14[1].magic + (uVar48 & 0xffffffff) * 2 + lVar50);
    puVar22 = (undefined8 *)
              ((long)&pPVar14[1].magic + (ulong)pPVar14->num_items * 4 + lVar56 + lVar50);
    if (pPVar14->magic != 0xdebcede0) {
      puVar22 = (undefined8 *)*puVar22;
    }
    uVar58 = (uVar49 + (params->dictionary).compound.total_size) -
             (params->dictionary).compound.chunk_offsets[sVar57];
    uVar54 = (ulong)pPVar14->source_size;
    puVar36 = (uint *)((long)&pPVar14[1].magic +
                      (ulong)(uVar20 + (&pPVar14[1].magic)
                                       [(uint)((int)uVar48 << (bVar43 & 0x1f)) >> (bVar43 & 0x1f)])
                      * 4 + lVar56 + lVar50);
    uVar20 = (uint)(uVar20 == 0xffff);
    lVar50 = 0;
    local_198 = local_160;
    local_188 = uVar39;
    do {
      if (lVar50 == 4) {
        do {
          do {
            do {
              do {
                if (uVar20 != 0) {
                  sVar57 = sVar57 + 1;
                  goto LAB_01f35bc7;
                }
                uVar20 = *puVar36;
                puVar36 = puVar36 + 1;
                uVar51 = (ulong)(uVar20 & 0x7fffffff);
                uVar20 = uVar20 & 0x80000000;
                uVar60 = uVar58 - uVar51;
                uVar48 = uVar54 - uVar51;
                if (local_140 <= uVar54 - uVar51) {
                  uVar48 = local_140;
                }
              } while ((((local_128 < uVar60) || (ringbuffer_mask < uVar29 + local_198)) ||
                       (uVar48 <= local_198)) ||
                      (ringbuffer[uVar29 + local_198] !=
                       *(uint8_t *)((long)puVar22 + local_198 + uVar51)));
              lVar50 = (long)puVar22 + uVar51;
              uVar45 = 0;
              lVar56 = 0;
              puVar42 = puVar61;
              uVar30 = uVar48;
LAB_01f35e6d:
              if (7 < uVar30) {
                if (*puVar42 == *(ulong *)(lVar50 + uVar45)) goto code_r0x01f35e80;
                uVar51 = *(ulong *)(lVar50 + uVar45) ^ *puVar42;
                uVar48 = 0;
                if (uVar51 != 0) {
                  for (; (uVar51 >> uVar48 & 1) == 0; uVar48 = uVar48 + 1) {
                  }
                }
                uVar48 = (uVar48 >> 3 & 0x1fffffff) - lVar56;
                goto LAB_01f35ed6;
              }
              lVar56 = uVar51 + uVar48 + (long)puVar22;
              for (; uVar48 != uVar45; uVar45 = uVar45 + 1) {
                if (*(char *)(lVar50 + uVar45) != *(char *)((long)puVar61 + uVar45)) {
                  lVar56 = uVar45 + lVar50;
                  break;
                }
              }
              uVar48 = lVar56 - lVar50;
LAB_01f35ed6:
            } while (uVar48 < 4);
            iVar38 = 0x1f;
            if ((uint)uVar60 != 0) {
              for (; (uint)uVar60 >> iVar38 == 0; iVar38 = iVar38 + -1) {
              }
            }
            uVar51 = (ulong)(iVar38 * -0x1e + 0x780) + uVar48 * 0x87;
          } while (uVar51 <= local_188);
          iVar35 = 0;
          uVar39 = uVar51;
          local_198 = uVar48;
          local_188 = uVar51;
          local_160 = uVar48;
          local_150 = uVar60;
        } while( true );
      }
      uVar48 = (ulong)dist_cache[lVar50];
      if ((uVar58 - uVar54 < uVar48) && (lVar56 = uVar58 - uVar48, uVar48 <= uVar58)) {
        uVar51 = uVar54 - lVar56;
        if (local_140 <= uVar54 - lVar56) {
          uVar51 = local_140;
        }
        uVar30 = 0;
        uVar60 = uVar51;
LAB_01f35cfd:
        if (uVar60 < 8) {
          for (pcVar32 = (char *)((long)puVar22 + uVar30 + lVar56);
              (uVar51 != uVar30 && (*pcVar32 == *(char *)((long)puVar61 + uVar30)));
              pcVar32 = pcVar32 + 1) {
            uVar30 = uVar30 + 1;
          }
        }
        else {
          uVar45 = *(ulong *)((long)puVar22 + uVar30 + lVar56);
          if (*(ulong *)((long)puVar61 + uVar30) == uVar45) goto code_r0x01f35d10;
          uVar45 = uVar45 ^ *(ulong *)((long)puVar61 + uVar30);
          uVar51 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
            }
          }
          uVar30 = uVar30 + (uVar51 >> 3 & 0x1fffffff);
        }
        if ((1 < uVar30) && (uVar51 = uVar30 * 0x87 + 0x78f, local_188 < uVar51)) {
          if (lVar50 != 0) {
            uVar51 = uVar51 - ((0x1ca10U >> ((byte)lVar50 & 2) & 4) + 0x27);
          }
          if (local_188 < uVar51) {
            if (local_198 < uVar30) {
              local_198 = uVar30;
            }
            iVar35 = 0;
            local_160 = uVar30;
            uVar39 = uVar51;
            local_150 = uVar48;
            local_188 = uVar51;
          }
        }
      }
      lVar50 = lVar50 + 1;
    } while( true );
  }
  if (uVar39 < 0x7e5) {
    local_180 = local_180 + 1;
    position = uVar23 + 1;
    if (uVar37 < position) {
      if (uVar37 + (uint)((int)lVar28 * 4) < position) {
        uVar48 = uVar23 + 0x11;
        if (uVar6 <= uVar23 + 0x11) {
          uVar48 = uVar6;
        }
        for (; position < uVar48; position = position + 4) {
          pvVar11 = (hasher->privat)._H40.extra[0];
          pvVar12 = (hasher->privat)._H40.extra[1];
          uVar20 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar23 = (ulong)uVar20;
          uVar25 = (hasher->privat)._H42.free_slot_idx[0];
          (hasher->privat)._H42.free_slot_idx[0] = uVar25 + 1;
          uVar49 = position - *(uint *)((long)pvVar11 + uVar23 * 4);
          *(char *)((long)pvVar11 + (position & 0xffff) + 0x30000) = (char)uVar20;
          if (0xfffe < uVar49) {
            uVar49 = 0xffff;
          }
          *(short *)((long)pvVar12 + (ulong)uVar25 * 4) = (short)uVar49;
          *(undefined2 *)((long)pvVar12 + (ulong)uVar25 * 4 + 2) =
               *(undefined2 *)((long)pvVar11 + uVar23 * 2 + 0x20000);
          *(int *)((long)pvVar11 + uVar23 * 4) = (int)position;
          *(ushort *)((long)pvVar11 + uVar23 * 2 + 0x20000) = uVar25;
          local_180 = local_180 + 4;
        }
      }
      else {
        uVar48 = uVar23 + 9;
        if (uVar5 <= uVar23 + 9) {
          uVar48 = uVar5;
        }
        for (; position < uVar48; position = position + 2) {
          pvVar11 = (hasher->privat)._H40.extra[0];
          pvVar12 = (hasher->privat)._H40.extra[1];
          uVar20 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
          uVar23 = (ulong)uVar20;
          uVar25 = (hasher->privat)._H42.free_slot_idx[0];
          (hasher->privat)._H42.free_slot_idx[0] = uVar25 + 1;
          uVar49 = position - *(uint *)((long)pvVar11 + uVar23 * 4);
          *(char *)((long)pvVar11 + (position & 0xffff) + 0x30000) = (char)uVar20;
          if (0xfffe < uVar49) {
            uVar49 = 0xffff;
          }
          *(short *)((long)pvVar12 + (ulong)uVar25 * 4) = (short)uVar49;
          *(undefined2 *)((long)pvVar12 + (ulong)uVar25 * 4 + 2) =
               *(undefined2 *)((long)pvVar11 + uVar23 * 2 + 0x20000);
          *(int *)((long)pvVar11 + uVar23 * 4) = (int)position;
          *(ushort *)((long)pvVar11 + uVar23 * 2 + 0x20000) = uVar25;
          local_180 = local_180 + 2;
        }
      }
    }
    goto LAB_01f3557c;
  }
  uVar48 = local_180 + 4;
  uVar37 = sVar8 + 1 + uVar23;
  local_118 = (lVar4 + num_bytes) - uVar23;
  local_f0 = 0;
  uVar25 = (hasher->privat)._H42.free_slot_idx[0];
LAB_01f36123:
  uVar49 = uVar21;
  if (uVar37 < uVar21) {
    uVar49 = uVar37;
  }
  local_140 = local_140 - 1;
  local_1a8 = local_160 - 1;
  if (local_140 <= local_160 - 1) {
    local_1a8 = local_140;
  }
  if (4 < params->quality) {
    local_1a8 = 0;
  }
  uVar54 = uVar23 + 1;
  uVar58 = uVar21;
  if (uVar54 < uVar21) {
    uVar58 = uVar54;
  }
  local_e8 = sVar8 + uVar23 + 1;
  if (uVar21 <= local_e8) {
    local_e8 = uVar21;
  }
  if ((params->dictionary).contextual.context_based != 0) {
    uVar51 = (ulong)bVar24;
    bVar24 = ringbuffer[uVar23 & ringbuffer_mask];
    local_ec = (uint)(params->dictionary).contextual.context_map
                     [literal_context_lut[uVar51 + 0x100] | literal_context_lut[bVar24]];
  }
  pBVar10 = (params->dictionary).contextual.dict[local_ec];
  pvVar11 = (hasher->privat)._H40.extra[0];
  pvVar12 = (hasher->privat)._H40.extra[1];
  uVar30 = uVar54 & ringbuffer_mask;
  puVar61 = (ulong *)(ringbuffer + uVar30);
  uVar20 = (uint)(*(int *)(ringbuffer + uVar30) * 0x1e35a7bd) >> 0x11;
  uVar29 = 0x7e4;
  uVar51 = 0;
  uVar60 = 0;
  lVar50 = 0;
  do {
    cVar59 = (char)uVar20;
    if (lVar50 == 10) {
      uVar53 = (ulong)uVar20;
      sVar57 = (hasher->privat)._H5.block_size_;
      uVar52 = uVar54 - *(uint *)((long)pvVar11 + uVar53 * 4);
      uVar26 = *(ushort *)((long)pvVar11 + uVar53 * 2 + 0x20000);
      uVar55 = 0;
      uVar45 = uVar52;
      uVar41 = local_1a8;
      do {
        local_1a8 = uVar41;
        local_190 = uVar29;
        local_1a0 = uVar60;
        local_170 = uVar51;
        do {
          do {
            do {
              do {
                bVar62 = sVar57 == 0;
                sVar57 = sVar57 - 1;
                if ((bVar62) || (uVar55 = uVar55 + uVar45, uVar58 < uVar55)) {
                  (hasher->privat)._H42.free_slot_idx[0] = uVar25 + 1;
                  *(char *)((long)pvVar11 + (uVar54 & 0xffff) + 0x30000) = cVar59;
                  if (0xfffe < uVar52) {
                    uVar52 = 0xffff;
                  }
                  *(short *)((long)pvVar12 + (ulong)uVar25 * 4) = (short)uVar52;
                  *(undefined2 *)((long)pvVar12 + (ulong)uVar25 * 4 + 2) =
                       *(undefined2 *)((long)pvVar11 + uVar53 * 2 + 0x20000);
                  *(int *)((long)pvVar11 + uVar53 * 4) = (int)uVar54;
                  *(ushort *)((long)pvVar11 + uVar53 * 2 + 0x20000) = uVar25;
                  if (local_190 == 0x7e4) {
                    pHVar13 = (hasher->privat)._H5.common_;
                    uVar58 = pHVar13->dict_num_lookups;
                    local_1a8 = pHVar13->dict_num_matches;
                    local_190 = 0x7e4;
                    if (uVar58 >> 7 <= local_1a8) {
                      uVar51 = (ulong)((uint)((int)*puVar61 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
                      puVar15 = pBVar10->hash_table_lengths;
                      local_190 = 0x7e4;
                      iVar38 = 0;
                      lVar50 = 0;
                      goto LAB_01f3659e;
                    }
                  }
                  iVar38 = 0;
                  goto LAB_01f36759;
                }
                uVar51 = (ulong)uVar26;
                uVar26 = *(ushort *)((long)pvVar12 + uVar51 * 4 + 2);
                uVar45 = (ulong)*(ushort *)((long)pvVar12 + uVar51 * 4);
              } while (ringbuffer_mask < local_1a8 + uVar30);
              uVar60 = uVar54 - uVar55 & ringbuffer_mask;
              uVar51 = uVar60 + local_1a8;
            } while ((ringbuffer_mask < uVar51) ||
                    (ringbuffer[local_1a8 + uVar30] != ringbuffer[uVar51]));
            puVar31 = (ulong *)(ringbuffer + uVar60);
            lVar50 = 0;
            puVar42 = puVar61;
            uVar51 = local_140;
LAB_01f36405:
            if (uVar51 < 8) {
              for (uVar60 = 0;
                  (uVar51 != uVar60 &&
                  (*(char *)((long)puVar31 + uVar60) == *(char *)((long)puVar42 + uVar60)));
                  uVar60 = uVar60 + 1) {
              }
            }
            else {
              if (*puVar42 == *puVar31) goto code_r0x01f36417;
              uVar60 = *puVar31 ^ *puVar42;
              uVar51 = 0;
              if (uVar60 != 0) {
                for (; (uVar60 >> uVar51 & 1) == 0; uVar51 = uVar51 + 1) {
                }
              }
              uVar60 = uVar51 >> 3 & 0x1fffffff;
            }
            uVar60 = uVar60 - lVar50;
          } while (uVar60 < 4);
          iVar38 = 0x1f;
          if ((uint)uVar55 != 0) {
            for (; (uint)uVar55 >> iVar38 == 0; iVar38 = iVar38 + -1) {
            }
          }
          uVar29 = (ulong)(iVar38 * -0x1e + 0x780) + uVar60 * 0x87;
          uVar51 = uVar55;
          uVar41 = uVar60;
        } while (uVar29 <= local_190);
      } while( true );
    }
    uVar41 = (ulong)dist_cache[lVar50];
    uVar45 = uVar54 - uVar41;
    if ((((lVar50 == 0) || (*(char *)((long)pvVar11 + (uVar45 & 0xffff) + 0x30000) == cVar59)) &&
        (uVar41 <= uVar58)) && (uVar45 < uVar54)) {
      puVar31 = (ulong *)(ringbuffer + (uVar45 & ringbuffer_mask));
      lVar56 = 0;
      uVar45 = local_140;
      puVar42 = puVar61;
LAB_01f362a4:
      if (uVar45 < 8) {
        for (uVar55 = 0;
            (uVar45 != uVar55 &&
            (*(char *)((long)puVar31 + uVar55) == *(char *)((long)puVar42 + uVar55)));
            uVar55 = uVar55 + 1) {
        }
      }
      else {
        if (*puVar42 == *puVar31) goto code_r0x01f362b6;
        uVar55 = *puVar31 ^ *puVar42;
        uVar45 = 0;
        if (uVar55 != 0) {
          for (; (uVar55 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
          }
        }
        uVar55 = uVar45 >> 3 & 0x1fffffff;
      }
      uVar55 = uVar55 - lVar56;
      if ((1 < uVar55) && (uVar45 = uVar55 * 0x87 + 0x78f, uVar29 < uVar45)) {
        if (lVar50 != 0) {
          uVar45 = uVar45 - ((0x1ca10U >> ((byte)lVar50 & 0xe) & 0xe) + 0x27);
        }
        if (uVar29 < uVar45) {
          uVar51 = uVar41;
          uVar60 = uVar55;
          uVar29 = uVar45;
          local_1a8 = uVar55;
        }
      }
    }
    lVar50 = lVar50 + 1;
  } while( true );
code_r0x01f35e80:
  puVar42 = puVar42 + 1;
  uVar30 = uVar30 - 8;
  lVar56 = lVar56 + -8;
  uVar45 = uVar45 + 8;
  goto LAB_01f35e6d;
code_r0x01f35d10:
  uVar60 = uVar60 - 8;
  uVar30 = uVar30 + 8;
  goto LAB_01f35cfd;
LAB_01f3659e:
  if (lVar50 == 2) goto LAB_01f36759;
  uVar58 = uVar58 + 1;
  pHVar13->dict_num_lookups = uVar58;
  bVar7 = puVar15[uVar51];
  uVar60 = (ulong)bVar7;
  if ((uVar60 != 0) && (uVar60 <= local_140)) {
    pBVar16 = pBVar10->words;
    puVar31 = (ulong *)(pBVar16->data +
                       (ulong)pBVar16->offsets_by_length[uVar60] +
                       pBVar10->hash_table_words[uVar51] * uVar60);
    lVar56 = 0;
    puVar42 = puVar61;
    uVar29 = uVar60;
LAB_01f3660f:
    if (uVar29 < 8) {
      for (uVar29 = 0;
          ((bVar7 & 7) != uVar29 &&
          (*(char *)((long)puVar42 + uVar29) == *(char *)((long)puVar31 + uVar29)));
          uVar29 = uVar29 + 1) {
      }
    }
    else {
      if (*puVar31 == *puVar42) goto code_r0x01f36621;
      uVar45 = *puVar42 ^ *puVar31;
      uVar29 = 0;
      if (uVar45 != 0) {
        for (; (uVar45 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
        }
      }
      uVar29 = uVar29 >> 3 & 0x1fffffff;
    }
    uVar29 = uVar29 - lVar56;
    if (((uVar29 != 0) && (uVar60 < pBVar10->cutoffTransformsCount + uVar29)) &&
       (uVar60 = (ulong)pBVar10->hash_table_words[uVar51] + lVar1 + local_e8 +
                 ((ulong)((uint)(pBVar10->cutoffTransforms >>
                                ((char)(uVar60 - uVar29) * '\x06' & 0x3fU)) & 0x3f) +
                  (uVar60 - uVar29) * 4 << (pBVar16->size_bits_by_length[uVar60] & 0x3f)),
       uVar60 <= local_128)) {
      iVar18 = 0x1f;
      if ((uint)uVar60 != 0) {
        for (; (uint)uVar60 >> iVar18 == 0; iVar18 = iVar18 + -1) {
        }
      }
      uVar45 = (uVar29 * 0x87 - (ulong)(uint)(iVar18 * 0x1e)) + 0x780;
      if (local_190 <= uVar45) {
        iVar38 = (uint)bVar7 - (int)uVar29;
        local_1a8 = local_1a8 + 1;
        pHVar13->dict_num_matches = local_1a8;
        local_190 = uVar45;
        local_170 = uVar60;
        local_1a0 = uVar29;
      }
    }
  }
  lVar50 = lVar50 + 1;
  uVar51 = uVar51 + 1;
  goto LAB_01f3659e;
code_r0x01f36621:
  puVar31 = puVar31 + 1;
  puVar42 = puVar42 + 1;
  uVar29 = uVar29 - 8;
  lVar56 = lVar56 + -8;
  goto LAB_01f3660f;
LAB_01f36759:
  local_128 = (params->dist).max_distance;
  sVar57 = (params->dictionary).compound.total_size;
  lVar50 = uVar49 + sVar57;
  sVar40 = 0;
LAB_01f3679c:
  if (sVar40 != (params->dictionary).compound.num_chunks) {
    pPVar14 = (params->dictionary).compound.chunks[sVar40];
    bVar7 = (byte)pPVar14->bucket_bits;
    bVar43 = (byte)pPVar14->slot_bits;
    bVar19 = -(char)pPVar14->hash_bits;
    uVar49 = ((*puVar61 << (bVar19 & 0x3f)) >> (bVar19 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
             (-bVar7 & 0x3f);
    lVar56 = (1L << (bVar43 & 0x3f)) * 4;
    lVar2 = (1L << (bVar7 & 0x3f)) * 2;
    bVar43 = -bVar43;
    uVar20 = (uint)*(ushort *)((long)&pPVar14[1].magic + (uVar49 & 0xffffffff) * 2 + lVar56);
    puVar22 = (undefined8 *)
              ((long)&pPVar14[1].magic + (ulong)pPVar14->num_items * 4 + lVar2 + lVar56);
    if (pPVar14->magic != 0xdebcede0) {
      puVar22 = (undefined8 *)*puVar22;
    }
    sVar17 = (params->dictionary).compound.chunk_offsets[sVar40];
    uVar51 = (local_e8 + sVar57) - sVar17;
    uVar58 = (ulong)pPVar14->source_size;
    puVar36 = (uint *)((long)&pPVar14[1].magic +
                      (ulong)(uVar20 + (&pPVar14[1].magic)
                                       [(uint)((int)uVar49 << (bVar43 & 0x1f)) >> (bVar43 & 0x1f)])
                      * 4 + lVar2 + lVar56);
    uVar20 = (uint)(uVar20 == 0xffff);
    lVar56 = 0;
    local_1b8 = local_1a0;
    local_198 = local_190;
    do {
      if (lVar56 == 4) {
        do {
          do {
            do {
              do {
                if (uVar20 != 0) {
                  sVar40 = sVar40 + 1;
                  goto LAB_01f3679c;
                }
                uVar20 = *puVar36;
                puVar36 = puVar36 + 1;
                uVar29 = (ulong)(uVar20 & 0x7fffffff);
                uVar20 = uVar20 & 0x80000000;
                uVar60 = uVar51 - uVar29;
                uVar49 = uVar58 - uVar29;
                if (local_140 <= uVar58 - uVar29) {
                  uVar49 = local_140;
                }
              } while (((local_128 < uVar60) || (ringbuffer_mask < uVar30 + local_1b8)) ||
                      ((uVar49 <= local_1b8 ||
                       (ringbuffer[uVar30 + local_1b8] !=
                        *(uint8_t *)((long)puVar22 + local_1b8 + uVar29)))));
              puVar31 = (ulong *)(uVar29 + (long)puVar22);
              lVar56 = 0;
              puVar42 = puVar61;
LAB_01f36a5d:
              if (uVar49 < 8) {
                for (uVar29 = 0;
                    (uVar49 != uVar29 &&
                    (*(char *)((long)puVar31 + uVar29) == *(char *)((long)puVar42 + uVar29)));
                    uVar29 = uVar29 + 1) {
                }
              }
              else {
                if (*puVar42 == *puVar31) goto code_r0x01f36a6f;
                uVar29 = *puVar31 ^ *puVar42;
                uVar49 = 0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                  }
                }
                uVar29 = uVar49 >> 3 & 0x1fffffff;
              }
              uVar29 = uVar29 - lVar56;
            } while (uVar29 < 4);
            iVar18 = 0x1f;
            if ((uint)uVar60 != 0) {
              for (; (uint)uVar60 >> iVar18 == 0; iVar18 = iVar18 + -1) {
              }
            }
            uVar49 = (ulong)(iVar18 * -0x1e + 0x780) + uVar29 * 0x87;
          } while (uVar49 <= local_198);
          iVar38 = 0;
          local_190 = uVar49;
          local_1b8 = uVar29;
          local_1a0 = uVar29;
          local_198 = uVar49;
          local_170 = uVar60;
        } while( true );
      }
      uVar49 = (ulong)dist_cache[lVar56];
      if ((uVar51 - uVar58 < uVar49) && (uVar49 <= uVar51)) {
        uVar60 = (uVar49 - uVar51) + uVar58;
        if (local_140 <= uVar60) {
          uVar60 = local_140;
        }
        lVar2 = (lVar50 - sVar17) - uVar49;
        uVar29 = 0;
LAB_01f368ec:
        if (uVar60 < 8) {
          pcVar32 = (char *)((long)puVar22 + uVar29 + lVar2);
          uVar60 = (sVar17 - lVar50) + uVar58 + uVar49;
          if (local_118 < uVar60) {
            uVar60 = local_118;
          }
          for (; (uVar60 != uVar29 && (*pcVar32 == *(char *)((long)puVar61 + uVar29)));
              pcVar32 = pcVar32 + 1) {
            uVar29 = uVar29 + 1;
          }
        }
        else {
          uVar45 = *(ulong *)((long)puVar22 + uVar29 + lVar2);
          if (*(ulong *)((long)puVar61 + uVar29) == uVar45) goto code_r0x01f368ff;
          uVar45 = uVar45 ^ *(ulong *)((long)puVar61 + uVar29);
          uVar60 = 0;
          if (uVar45 != 0) {
            for (; (uVar45 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
            }
          }
          uVar29 = uVar29 + (uVar60 >> 3 & 0x1fffffff);
        }
        if ((1 < uVar29) && (uVar60 = uVar29 * 0x87 + 0x78f, local_198 < uVar60)) {
          if (lVar56 != 0) {
            uVar60 = uVar60 - ((0x1ca10U >> ((byte)lVar56 & 2) & 4) + 0x27);
          }
          if (local_198 < uVar60) {
            if (local_1b8 < uVar29) {
              local_1b8 = uVar29;
            }
            iVar38 = 0;
            local_170 = uVar49;
            local_1a0 = uVar29;
            local_190 = uVar60;
            local_198 = uVar60;
          }
        }
      }
      lVar56 = lVar56 + 1;
    } while( true );
  }
  if (local_190 < uVar39 + 0xaf) {
    uVar54 = uVar23;
    sVar57 = local_180;
    local_e8 = uVar23 + sVar8;
    iVar38 = iVar35;
    if (uVar21 <= uVar23 + sVar8) {
      local_e8 = uVar21;
    }
    goto LAB_01f36c06;
  }
  local_160 = local_1a0;
  local_150 = local_170;
  sVar57 = uVar48;
  if (local_f0 == 3) goto LAB_01f36c06;
  local_180 = local_180 + 1;
  local_f0 = local_f0 + 1;
  uVar49 = uVar23 + 5;
  uVar37 = uVar37 + 1;
  local_118 = local_118 - 1;
  uVar23 = uVar54;
  uVar39 = local_190;
  sVar57 = local_180;
  iVar35 = iVar38;
  uVar25 = uVar25 + 1;
  if (uVar3 <= uVar49) goto LAB_01f36c06;
  goto LAB_01f36123;
code_r0x01f36a6f:
  puVar42 = puVar42 + 1;
  puVar31 = puVar31 + 1;
  uVar49 = uVar49 - 8;
  lVar56 = lVar56 + -8;
  goto LAB_01f36a5d;
code_r0x01f368ff:
  uVar60 = uVar60 - 8;
  uVar29 = uVar29 + 8;
  goto LAB_01f368ec;
LAB_01f36c06:
  local_180 = sVar57;
  local_e8 = local_e8 + sVar9;
  if (local_e8 < local_150) {
LAB_01f36c23:
    uVar37 = local_150 + 0xf;
  }
  else {
    if (local_150 == (long)*dist_cache) {
      uVar37 = 0;
      goto LAB_01f36cc4;
    }
    uVar37 = 1;
    if (local_150 != (long)dist_cache[1]) {
      uVar37 = (local_150 + 3) - (long)*dist_cache;
      if (uVar37 < 7) {
        bVar24 = (byte)((int)uVar37 << 2);
        uVar20 = 0x9750468;
      }
      else {
        uVar37 = (local_150 + 3) - (long)dist_cache[1];
        if (6 < uVar37) {
          uVar37 = 2;
          if ((local_150 != (long)dist_cache[2]) && (uVar37 = 3, local_150 != (long)dist_cache[3]))
          goto LAB_01f36c23;
          goto LAB_01f36c27;
        }
        bVar24 = (byte)((int)uVar37 << 2);
        uVar20 = 0xfdb1ace;
      }
      uVar37 = (ulong)(uVar20 >> (bVar24 & 0x1f) & 0xf);
    }
  }
LAB_01f36c27:
  if ((local_150 <= local_e8) && (uVar37 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    iVar35 = (int)local_150;
    *dist_cache = iVar35;
    dist_cache[4] = iVar35 + -1;
    dist_cache[5] = iVar35 + 1;
    dist_cache[6] = iVar35 + -2;
    dist_cache[7] = iVar35 + 2;
    dist_cache[8] = iVar35 + -3;
    dist_cache[9] = iVar35 + 3;
  }
LAB_01f36cc4:
  uVar20 = (uint)local_180;
  local_108->insert_len_ = uVar20;
  local_108->copy_len_ = iVar38 << 0x19 | (uint)local_160;
  uVar48 = (ulong)(params->dist).num_direct_distance_codes;
  uVar23 = uVar48 + 0x10;
  uVar33 = 0;
  if (uVar23 <= uVar37) {
    uVar47 = (params->dist).distance_postfix_bits;
    bVar24 = (byte)uVar47;
    uVar48 = ((4L << (bVar24 & 0x3f)) + (uVar37 - uVar48)) - 0x10;
    uVar46 = 0x1f;
    uVar34 = (uint)uVar48;
    if (uVar34 != 0) {
      for (; uVar34 >> uVar46 == 0; uVar46 = uVar46 - 1) {
      }
    }
    uVar46 = (uVar46 ^ 0xffffffe0) + 0x1f;
    uVar49 = (ulong)((uVar48 >> ((ulong)uVar46 & 0x3f) & 1) != 0);
    lVar50 = (ulong)uVar46 - (ulong)uVar47;
    uVar37 = (~(-1 << (bVar24 & 0x1f)) & uVar34) + uVar23 +
             (uVar49 + lVar50 * 2 + 0xfffe << (bVar24 & 0x3f)) | lVar50 * 0x400;
    uVar33 = (uint32_t)(uVar48 - (uVar49 + 2 << ((byte)uVar46 & 0x3f)) >> (bVar24 & 0x3f));
  }
  local_108->dist_prefix_ = (uint16_t)uVar37;
  local_108->dist_extra_ = uVar33;
  if (5 < local_180) {
    if (local_180 < 0x82) {
      uVar20 = 0x1f;
      uVar47 = (uint)(local_180 - 2);
      if (uVar47 != 0) {
        for (; uVar47 >> uVar20 == 0; uVar20 = uVar20 - 1) {
        }
      }
      uVar20 = (int)(local_180 - 2 >> ((char)(uVar20 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
               (uVar20 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (local_180 < 0x842) {
      uVar47 = 0x1f;
      if (uVar20 - 0x42 != 0) {
        for (; uVar20 - 0x42 >> uVar47 == 0; uVar47 = uVar47 - 1) {
        }
      }
      uVar20 = (uVar47 ^ 0xffe0) + 0x2a;
    }
    else {
      uVar20 = 0x15;
      if (0x1841 < local_180) {
        uVar20 = (uint)(ushort)(0x17 - (local_180 < 0x5842));
      }
    }
  }
  uVar47 = iVar38 + (uint)local_160;
  if (uVar47 < 10) {
    uVar46 = uVar47 - 2;
  }
  else if (uVar47 < 0x86) {
    uVar47 = uVar47 - 6;
    uVar46 = 0x1f;
    if (uVar47 != 0) {
      for (; uVar47 >> uVar46 == 0; uVar46 = uVar46 - 1) {
      }
    }
    uVar46 = (uVar47 >> ((char)(uVar46 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar46 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar46 = 0x17;
    if (uVar47 < 0x846) {
      uVar46 = 0x1f;
      if (uVar47 - 0x46 != 0) {
        for (; uVar47 - 0x46 >> uVar46 == 0; uVar46 = uVar46 - 1) {
        }
      }
      uVar46 = (uVar46 ^ 0xffe0) + 0x2c;
    }
  }
  uVar25 = (ushort)uVar46;
  uVar44 = (uVar25 & 7) + ((ushort)uVar20 & 7) * 8;
  if ((((uVar37 & 0x3ff) == 0) && ((ushort)uVar20 < 8)) && (uVar25 < 0x10)) {
    if (7 < uVar25) {
      uVar44 = uVar44 + 0x40;
    }
  }
  else {
    iVar35 = ((uVar20 & 0xffff) >> 3) * 3 + ((uVar46 & 0xffff) >> 3);
    uVar44 = uVar44 + ((ushort)(0x520d40 >> ((char)iVar35 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar35 * 0x40 + 0x40;
  }
  local_108->cmd_prefix_ = uVar44;
  *num_literals = *num_literals + local_180;
  position = local_160 + uVar54;
  uVar23 = sVar27;
  if (position < sVar27) {
    uVar23 = position;
  }
  uVar48 = uVar54 + 2;
  if (local_150 < local_160 >> 2) {
    uVar37 = position + local_150 * -4;
    if (uVar37 < uVar48) {
      uVar37 = uVar48;
    }
    uVar48 = uVar37;
    if (uVar23 < uVar37) {
      uVar48 = uVar23;
    }
  }
  uVar37 = uVar54 + lVar28 + local_160 * 2;
  local_108 = local_108 + 1;
  for (; uVar48 < uVar23; uVar48 = uVar48 + 1) {
    pvVar11 = (hasher->privat)._H40.extra[0];
    pvVar12 = (hasher->privat)._H40.extra[1];
    uVar20 = (uint)(*(int *)(ringbuffer + (uVar48 & ringbuffer_mask)) * 0x1e35a7bd) >> 0x11;
    uVar49 = (ulong)uVar20;
    uVar25 = (hasher->privat)._H42.free_slot_idx[0];
    (hasher->privat)._H42.free_slot_idx[0] = uVar25 + 1;
    uVar54 = uVar48 - *(uint *)((long)pvVar11 + uVar49 * 4);
    *(char *)((long)pvVar11 + (uVar48 & 0xffff) + 0x30000) = (char)uVar20;
    if (0xfffe < uVar54) {
      uVar54 = 0xffff;
    }
    *(short *)((long)pvVar12 + (ulong)uVar25 * 4) = (short)uVar54;
    *(undefined2 *)((long)pvVar12 + (ulong)uVar25 * 4 + 2) =
         *(undefined2 *)((long)pvVar11 + uVar49 * 2 + 0x20000);
    *(int *)((long)pvVar11 + uVar49 * 4) = (int)uVar48;
    *(ushort *)((long)pvVar11 + uVar49 * 2 + 0x20000) = uVar25;
  }
  local_180 = 0;
  goto LAB_01f3556e;
code_r0x01f36417:
  puVar42 = puVar42 + 1;
  puVar31 = puVar31 + 1;
  uVar51 = uVar51 - 8;
  lVar50 = lVar50 + -8;
  goto LAB_01f36405;
code_r0x01f362b6:
  puVar42 = puVar42 + 1;
  puVar31 = puVar31 + 1;
  uVar45 = uVar45 - 8;
  lVar56 = lVar56 + -8;
  goto LAB_01f362a4;
code_r0x01f35a6c:
  puVar31 = puVar31 + 1;
  puVar42 = puVar42 + 1;
  uVar60 = uVar60 - 8;
  lVar56 = lVar56 + -8;
  goto LAB_01f35a5a;
code_r0x01f3585d:
  puVar42 = puVar42 + 1;
  puVar31 = puVar31 + 1;
  uVar58 = uVar58 - 8;
  lVar50 = lVar50 + -8;
  goto LAB_01f3584c;
code_r0x01f356fa:
  puVar42 = puVar42 + 1;
  puVar31 = puVar31 + 1;
  uVar30 = uVar30 - 8;
  lVar56 = lVar56 + -8;
  goto LAB_01f356e9;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}